

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resize.c
# Opt level: O1

_Bool av1_resize_plane(uint8_t *input,int height,int width,int in_stride,uint8_t *output,int height2
                      ,int width2,int out_stride)

{
  int iVar1;
  uint8_t *memblk;
  uint8_t *otmp;
  uint8_t *input_00;
  uint8_t *output_00;
  long lVar2;
  ulong uVar3;
  uint8_t *puVar4;
  long lVar5;
  undefined1 auVar6 [16];
  char local_3c;
  
  lVar5 = (long)width2;
  memblk = (uint8_t *)aom_malloc(lVar5 * height);
  iVar1 = height;
  if (height < width) {
    iVar1 = width;
  }
  otmp = (uint8_t *)aom_malloc((long)iVar1);
  input_00 = (uint8_t *)aom_malloc((long)height);
  output_00 = (uint8_t *)aom_malloc((long)height2);
  auVar6._0_4_ = -(uint)((int)((ulong)memblk >> 0x20) == 0 && (int)memblk == 0);
  auVar6._4_4_ = -(uint)((int)otmp == 0 && (int)((ulong)otmp >> 0x20) == 0);
  auVar6._8_4_ = -(uint)((int)((ulong)input_00 >> 0x20) == 0 && (int)input_00 == 0);
  auVar6._12_4_ = -(uint)((int)output_00 == 0 && (int)((ulong)output_00 >> 0x20) == 0);
  iVar1 = movmskps((int)output_00,auVar6);
  if (iVar1 == 0) {
    uVar3 = (ulong)(uint)height;
    if (0 < height) {
      puVar4 = memblk;
      do {
        resize_multistep(input,width,puVar4,width2,otmp);
        puVar4 = puVar4 + lVar5;
        input = input + in_stride;
        uVar3 = uVar3 - 1;
      } while (uVar3 != 0);
    }
    if (0 < width2) {
      uVar3 = 0;
      do {
        if (0 < height) {
          puVar4 = memblk + uVar3;
          lVar2 = 0;
          do {
            input_00[lVar2] = *puVar4;
            puVar4 = puVar4 + lVar5;
            lVar2 = lVar2 + 1;
          } while (height != (int)lVar2);
        }
        resize_multistep(input_00,height,output_00,height2,otmp);
        if (0 < height2) {
          puVar4 = output + uVar3;
          lVar2 = 0;
          do {
            *puVar4 = output_00[lVar2];
            puVar4 = puVar4 + out_stride;
            lVar2 = lVar2 + 1;
          } while (height2 != (int)lVar2);
        }
        uVar3 = uVar3 + 1;
      } while (uVar3 != (uint)width2);
    }
  }
  local_3c = (char)iVar1;
  aom_free(memblk);
  aom_free(otmp);
  aom_free(input_00);
  aom_free(output_00);
  return local_3c == '\0';
}

Assistant:

bool av1_resize_plane(const uint8_t *input, int height, int width,
                      int in_stride, uint8_t *output, int height2, int width2,
                      int out_stride) {
  int i;
  bool mem_status = true;
  uint8_t *intbuf = (uint8_t *)aom_malloc(sizeof(uint8_t) * width2 * height);
  uint8_t *tmpbuf =
      (uint8_t *)aom_malloc(sizeof(uint8_t) * AOMMAX(width, height));
  uint8_t *arrbuf = (uint8_t *)aom_malloc(sizeof(uint8_t) * height);
  uint8_t *arrbuf2 = (uint8_t *)aom_malloc(sizeof(uint8_t) * height2);
  if (intbuf == NULL || tmpbuf == NULL || arrbuf == NULL || arrbuf2 == NULL) {
    mem_status = false;
    goto Error;
  }
  assert(width > 0);
  assert(height > 0);
  assert(width2 > 0);
  assert(height2 > 0);
  for (i = 0; i < height; ++i)
    resize_multistep(input + in_stride * i, width, intbuf + width2 * i, width2,
                     tmpbuf);
  for (i = 0; i < width2; ++i) {
    fill_col_to_arr(intbuf + i, width2, height, arrbuf);
    resize_multistep(arrbuf, height, arrbuf2, height2, tmpbuf);
    fill_arr_to_col(output + i, out_stride, height2, arrbuf2);
  }

Error:
  aom_free(intbuf);
  aom_free(tmpbuf);
  aom_free(arrbuf);
  aom_free(arrbuf2);
  return mem_status;
}